

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

qsizetype QtPrivate::QStringList_indexOf(QStringList *that,QRegularExpression *re,qsizetype from)

{
  bool bVar1;
  PatternOptions options;
  long lVar2;
  long in_FS_OFFSET;
  QRegularExpressionMatch m;
  QRegularExpression exactRe;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (from < 0) {
    from = from + (that->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::pattern((QString *)&exactRe,re);
  QRegularExpression::anchoredPattern((QString *)&local_58,(QString *)&exactRe);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&exactRe);
  exactRe.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  options = QRegularExpression::patternOptions(re);
  QRegularExpression::QRegularExpression(&exactRe,(QString *)&local_58,options);
  lVar2 = from * 0x18;
  for (; (ulong)from < (ulong)(that->d).size; from = from + 1) {
    m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QRegularExpression::match
              ((QRegularExpression *)&m,(QString *)&exactRe,(long)&(((that->d).ptr)->d).d + lVar2,
               NormalMatch,(MatchOptions)0x0);
    bVar1 = QRegularExpressionMatch::hasMatch(&m);
    QRegularExpressionMatch::~QRegularExpressionMatch(&m);
    if (bVar1) goto LAB_00301fc6;
    lVar2 = lVar2 + 0x18;
  }
  from = 0xffffffffffffffff;
LAB_00301fc6:
  QRegularExpression::~QRegularExpression(&exactRe);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return from;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::QStringList_indexOf(const QStringList *that, const QRegularExpression &re, qsizetype from)
{
    if (from < 0)
        from = qMax(from + that->size(), qsizetype(0));

    QString exactPattern = QRegularExpression::anchoredPattern(re.pattern());
    QRegularExpression exactRe(exactPattern, re.patternOptions());

    for (qsizetype i = from; i < that->size(); ++i) {
        QRegularExpressionMatch m = exactRe.match(that->at(i));
        if (m.hasMatch())
            return i;
    }
    return -1;
}